

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O0

spair * __thiscall badlywrapped<spair>::get(spair *__return_storage_ptr__,badlywrapped<spair> *this)

{
  badlywrapped<spair> *this_local;
  
  spair::spair(__return_storage_ptr__,&this->value);
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD T get() const { return value; }